

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

int loguru::shutdown(int __fd,int __how)

{
  int iVar1;
  Verbosity VVar2;
  int extraout_EAX;
  double __x;
  
  iVar1 = g_internal_verbosity;
  VVar2 = current_verbosity_cutoff();
  if (iVar1 <= VVar2) {
    log(__x);
  }
  remove_all_callbacks();
  set_fatal_handler((fatal_handler_t)0x0);
  set_verbosity_to_name_callback((verbosity_to_name_t)0x0);
  set_name_to_verbosity_callback((name_to_verbosity_t)0x0);
  return extraout_EAX;
}

Assistant:

void shutdown()
	{
		VLOG_F(g_internal_verbosity, "loguru::shutdown()");
		remove_all_callbacks();
		set_fatal_handler(nullptr);
		set_verbosity_to_name_callback(nullptr);
		set_name_to_verbosity_callback(nullptr);
	}